

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_objref.cpp
# Opt level: O0

bool __thiscall ON_ObjRef::Read(ON_ObjRef *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  osnap_mode oVar2;
  ON__INT32 local_30;
  byte local_29;
  int osmode;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *archive_local;
  ON_ObjRef *this_local;
  
  iStack_24 = 0;
  osmode = 0;
  _minor_version = archive;
  archive_local = (ON_BinaryArchive *)this;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(archive,0x40008000,&stack0xffffffffffffffdc,&osmode);
  if (bVar1) {
    local_29 = iStack_24 == 1;
    if ((((((bool)local_29) &&
          (local_29 = ON_BinaryArchive::ReadUuid(_minor_version,&this->m_uuid), (bool)local_29)) &&
         (local_29 = ON_BinaryArchive::ReadComponentIndex(_minor_version,&this->m_component_index),
         (bool)local_29)) &&
        (((local_29 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_geometry_type),
          (bool)local_29 &&
          (local_29 = ON_BinaryArchive::ReadPoint(_minor_version,&this->m_point), (bool)local_29))
         && ((local_29 = ON_BinaryArchive::ReadInt(_minor_version,&(this->m_evp).m_t_type),
             (bool)local_29 &&
             ((local_29 = ON_BinaryArchive::ReadComponentIndex(_minor_version,&(this->m_evp).m_t_ci)
              , (bool)local_29 &&
              (local_29 = ON_BinaryArchive::ReadDouble(_minor_version,4,(this->m_evp).m_t),
              (bool)local_29)))))))) &&
       ((local_29 = ON_BinaryArchive::ReadArray(_minor_version,&this->m__iref), (bool)local_29 &&
        (((((0 < osmode &&
            (local_29 = ON_BinaryArchive::ReadInterval
                                  (_minor_version,(ON_Interval *)&(this->m_evp).field_0x28),
            (bool)local_29)) &&
           (local_29 = ON_BinaryArchive::ReadInterval
                                 (_minor_version,(ON_Interval *)&(this->m_evp).field_0x38),
           (bool)local_29)) &&
          ((1 < osmode &&
           (local_29 = ON_BinaryArchive::ReadInterval
                                 (_minor_version,(ON_Interval *)&(this->m_evp).field_0x48),
           (bool)local_29)))) && (2 < osmode)))))) {
      local_30 = 0;
      local_29 = ON_BinaryArchive::ReadInt(_minor_version,&local_30);
      if ((bool)local_29) {
        oVar2 = ON::OSnapMode(local_30);
        this->m_osnap_mode = oVar2;
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      local_29 = 0;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjRef::Read( ON_BinaryArchive& archive )
{
  int major_version = 0;
  int minor_version = 0;
  bool rc = archive.BeginRead3dmChunk( TCODE_ANONYMOUS_CHUNK, &major_version, &minor_version );
  if ( !rc )
    return false;

  for(;;)
  {
    rc = (1 == major_version);
    if (!rc) break;

    rc = archive.ReadUuid(m_uuid);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_component_index);
    if (!rc) break;

    rc = archive.ReadInt(&m_geometry_type);
    if (!rc) break;

    rc = archive.ReadPoint(m_point);
    if (!rc) break;

    // Prior to 13 July 2006, the evaluation parameters
    // m_evp were members of ON_ObjRef.  That's why the
    // m_evp fields are read directly rather than
    // using m_evp.Read().
    rc = archive.ReadInt(&m_evp.m_t_type);
    if (!rc) break;

    rc = archive.ReadComponentIndex(m_evp.m_t_ci);
    if (!rc) break;

    rc = archive.ReadDouble(4,m_evp.m_t);
    if (!rc) break;

    rc = archive.ReadArray(m__iref);
    if (!rc) break;

    if ( minor_version >= 1 )
    {
      // 1.1 IO fields
      rc = archive.ReadInterval(m_evp.m_s[0]);
      if (!rc) break;
      rc = archive.ReadInterval(m_evp.m_s[1]);
      if (!rc) break;
      if ( minor_version >= 2 )
      {
        rc = archive.ReadInterval(m_evp.m_s[2]);
        if (!rc) break;
        if (minor_version >= 3)
        {
          int osmode = 0;
          rc = archive.ReadInt(&osmode);
          if (!rc) break;
          m_osnap_mode = ON::OSnapMode(osmode);
        }
      }
    }

    break;
  }

  if ( !archive.EndRead3dmChunk() )
    rc = false;
  return rc;
}